

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::mouse_event(Application *this,int key,int event,uchar mods)

{
  e_mouse_button eStack_8;
  
  if (event == 0) {
    if (key == 2) {
      this->middleDown = false;
      updateWidgets(this);
      return;
    }
    if (key == 1) {
      this->rightDown = false;
      updateWidgets(this);
      return;
    }
    if (key == 0) {
      mouse_released(this,LEFT);
      return;
    }
  }
  else if (event == 1) {
    if (key == 2) {
      eStack_8 = MIDDLE;
    }
    else {
      if (key != 1) {
        if (key != 0) {
          return;
        }
        mouse_pressed(this,LEFT);
        return;
      }
      eStack_8 = RIGHT;
    }
    mouse_pressed(this,eStack_8);
    return;
  }
  return;
}

Assistant:

void Application::mouse_event(int key, int event, unsigned char mods) {
  switch(event) {
    case EVENT_PRESS:
      switch(key) {
        case MOUSE_LEFT:
          mouse_pressed(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_pressed(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_pressed(MIDDLE);
          break;
      }
      break;
    case EVENT_RELEASE:
      switch(key) {
        case MOUSE_LEFT:
          mouse_released(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_released(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_released(MIDDLE);
          break;
      }
      break;
  }
}